

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# os.c
# Opt level: O0

char * sx_os_path_winpath(char *dst,int size,char *path)

{
  int iVar1;
  int local_38;
  int local_34;
  int i;
  int var__b;
  int var__a;
  int len;
  char *path_local;
  int size_local;
  char *dst_local;
  
  iVar1 = sx_strlen(path);
  local_38 = size + -1;
  if (iVar1 < local_38) {
    local_38 = iVar1;
  }
  for (local_34 = 0; local_34 < local_38; local_34 = local_34 + 1) {
    if (path[local_34] == '/') {
      dst[local_34] = '\\';
    }
    else {
      dst[local_34] = path[local_34];
    }
  }
  dst[local_38] = '\0';
  return dst;
}

Assistant:

char* sx_os_path_winpath(char* dst, int size, const char* path)
{
    int len = sx_strlen(path);
    len = sx_min(len, size - 1);

    for (int i = 0; i < len; i++) {
        if (path[i] != '/')
            dst[i] = path[i];
        else
            dst[i] = '\\';
    }
    dst[len] = '\0';
    return dst;
}